

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O2

int mdb_pages_xkeep(MDB_cursor *mc,uint pflags,int all)

{
  ushort uVar1;
  ushort uVar2;
  MDB_txn *pMVar3;
  MDB_xcursor *pMVar4;
  pgno_t pgno;
  byte bVar5;
  MDB_xcursor *pMVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  MDB_xcursor *pMVar10;
  MDB_cursor *pMVar11;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  int level;
  MDB_page *dp;
  
  pMVar3 = mc->mc_txn;
  pMVar10 = (MDB_xcursor *)0x0;
  if ((mc->mc_flags & 0x40) == 0) {
    pMVar10 = (MDB_xcursor *)mc;
  }
  uVar8 = (ulong)pMVar3->mt_numdbs;
  uVar9 = uVar8;
  do {
    while (pMVar10 == (MDB_xcursor *)0x0) {
      bVar14 = uVar9 == 0;
      uVar9 = uVar9 - 1;
      if (bVar14) {
        if (all != 0) {
          lVar13 = 0x28;
          for (uVar9 = 0; uVar9 < uVar8; uVar9 = uVar9 + 1) {
            if (((pMVar3->mt_dbflags[uVar9] & 1) != 0) &&
               (pgno = *(pgno_t *)((long)&pMVar3->mt_dbs->md_pad + lVar13),
               pgno != 0xffffffffffffffff)) {
              iVar7 = mdb_page_get(mc,pgno,&dp,&level);
              if (iVar7 != 0) {
                return iVar7;
              }
              if (((dp->mp_flags & 0xc050) == pflags) && (level < 2)) {
                dp->mp_flags = dp->mp_flags ^ 0x8000;
              }
            }
            uVar8 = (ulong)pMVar3->mt_numdbs;
            lVar13 = lVar13 + 0x30;
          }
        }
        return 0;
      }
      pMVar10 = (MDB_xcursor *)pMVar3->mt_cursors[uVar9];
    }
    bVar5 = *(byte *)((long)&pMVar10->mx_cursor + 0x44) & 1;
    pMVar6 = pMVar10;
    while (bVar5 != 0) {
      uVar1 = *(unsigned_short *)((long)&pMVar6->mx_cursor + 0x40);
      pMVar11 = (MDB_cursor *)0x0;
      for (uVar12 = 0; uVar1 != uVar12; uVar12 = uVar12 + 1) {
        pMVar11 = *(MDB_cursor **)((long)&pMVar6->mx_cursor + (uVar12 + 9) * 8);
        uVar2 = *(ushort *)((long)&pMVar11->mc_backup + 2);
        if ((uVar2 & 0xc050) == pflags) {
          *(ushort *)((long)&pMVar11->mc_backup + 2) = uVar2 ^ 0x8000;
        }
      }
      pMVar4 = *(MDB_xcursor **)((long)&pMVar6->mx_cursor + 0x10);
      if ((((pMVar4 == (MDB_xcursor *)0x0) || (pMVar11 == (MDB_cursor *)0x0)) ||
          (((pMVar4->mx_cursor).mc_flags & 1) == 0)) || (((ulong)pMVar11->mc_backup & 0x20000) == 0)
         ) break;
      bVar5 = *(byte *)((long)pMVar11->mc_pg +
                       ((ulong)*(ushort *)
                                ((long)pMVar11->mc_pg +
                                (ulong)(pMVar6->mx_cursor).mc_ki[uVar1 - 1] * 2 + -0x38) - 0x44)) &
              2;
      pMVar6 = pMVar4;
    }
    pMVar10 = *(MDB_xcursor **)&pMVar10->mx_cursor;
  } while( true );
}

Assistant:

static int
mdb_pages_xkeep(MDB_cursor *mc, unsigned pflags, int all)
{
	enum { Mask = P_SUBP|P_DIRTY|P_LOOSE|P_KEEP };
	MDB_txn *txn = mc->mc_txn;
	MDB_cursor *m3, *m0 = mc;
	MDB_xcursor *mx;
	MDB_page *dp, *mp;
	MDB_node *leaf;
	unsigned i, j;
	int rc = MDB_SUCCESS, level;

	/* Mark pages seen by cursors */
	if (mc->mc_flags & C_UNTRACK)
		mc = NULL;				/* will find mc in mt_cursors */
	for (i = txn->mt_numdbs;; mc = txn->mt_cursors[--i]) {
		for (; mc; mc=mc->mc_next) {
			if (!(mc->mc_flags & C_INITIALIZED))
				continue;
			for (m3 = mc;; m3 = &mx->mx_cursor) {
				mp = NULL;
				for (j=0; j<m3->mc_snum; j++) {
					mp = m3->mc_pg[j];
					if ((mp->mp_flags & Mask) == pflags)
						mp->mp_flags ^= P_KEEP;
				}
				mx = m3->mc_xcursor;
				/* Proceed to mx if it is at a sub-database */
				if (! (mx && (mx->mx_cursor.mc_flags & C_INITIALIZED)))
					break;
				if (! (mp && (mp->mp_flags & P_LEAF)))
					break;
				leaf = NODEPTR(mp, m3->mc_ki[j-1]);
				if (!(leaf->mn_flags & F_SUBDATA))
					break;
			}
		}
		if (i == 0)
			break;
	}

	if (all) {
		/* Mark dirty root pages */
		for (i=0; i<txn->mt_numdbs; i++) {
			if (txn->mt_dbflags[i] & DB_DIRTY) {
				pgno_t pgno = txn->mt_dbs[i].md_root;
				if (pgno == P_INVALID)
					continue;
				if ((rc = mdb_page_get(m0, pgno, &dp, &level)) != MDB_SUCCESS)
					break;
				if ((dp->mp_flags & Mask) == pflags && level <= 1)
					dp->mp_flags ^= P_KEEP;
			}
		}
	}

	return rc;
}